

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O1

void __thiscall
HighsSymmetryDetection::markCellForRefinement(HighsSymmetryDetection *this,HighsInt cell)

{
  int iVar1;
  pointer puVar2;
  iterator __position;
  pointer piVar3;
  pointer piVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  HighsInt local_c;
  
  if (((this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[cell] - cell != 1) &&
     (puVar2 = (this->cellInRefinementQueue).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start, puVar2[cell] == '\0')) {
    puVar2[cell] = '\x01';
    __position._M_current =
         (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_c = cell;
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->refinementQueue,__position,&local_c);
    }
    else {
      *__position._M_current = cell;
      (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    piVar3 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar1 = piVar4[-1];
    lVar7 = (long)piVar4 - (long)piVar3 >> 2;
    lVar6 = lVar7 + -1;
    if (1 < lVar7) {
      do {
        lVar7 = (lVar6 - (lVar6 + -1 >> 0x3f)) + -1 >> 1;
        if (piVar3[lVar7] <= iVar1) break;
        piVar3[lVar6] = piVar3[lVar7];
        bVar5 = 2 < lVar6;
        lVar6 = lVar7;
      } while (bVar5);
    }
    piVar3[lVar6] = iVar1;
  }
  return;
}

Assistant:

void HighsSymmetryDetection::markCellForRefinement(HighsInt cell) {
  if (cellSize(cell) == 1 || cellInRefinementQueue[cell]) return;

  cellInRefinementQueue[cell] = true;
  refinementQueue.push_back(cell);
  std::push_heap(refinementQueue.begin(), refinementQueue.end(),
                 std::greater<HighsInt>());
}